

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O3

char * tr_tcp_ident(void *socket)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t size;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (socket == (void *)0x0) {
    __assert_fail("sock",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                  ,0x13e,"const char *tr_tcp_ident(void *)");
  }
  pcVar4 = *(char **)((long)socket + 0x38);
  if (pcVar4 == (char *)0x0) {
    sVar2 = strlen(*(char **)((long)socket + 0x10));
    sVar3 = strlen(*(char **)((long)socket + 8));
    size = sVar2 + sVar3 + 2;
    pcVar4 = (char *)lrtr_malloc(size);
    *(char **)((long)socket + 0x38) = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      snprintf(pcVar4,size,"%s:%s",*(undefined8 *)((long)socket + 8),
               *(undefined8 *)((long)socket + 0x10));
      pcVar4 = *(char **)((long)socket + 0x38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar4;
  }
  __stack_chk_fail();
}

Assistant:

const char *tr_tcp_ident(void *socket)
{
	size_t len;
	struct tr_tcp_socket *sock = socket;

	assert(sock);

	if (sock->ident)
		return sock->ident;

	len = strlen(sock->config.port) + strlen(sock->config.host) + 2;
	sock->ident = lrtr_malloc(len);
	if (!sock->ident)
		return NULL;
	snprintf(sock->ident, len, "%s:%s", sock->config.host, sock->config.port);

	return sock->ident;
}